

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_immediate_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_dbfc4::CpuImmediateTest::run_instruction
          (CpuImmediateTest *this,uint8_t instruction)

{
  uint16_t uVar1;
  ushort uVar2;
  code *pcVar3;
  bool bVar4;
  MockSpec<unsigned_char_(unsigned_short)> *this_00;
  TypedExpectation<unsigned_char_(unsigned_short)> *this_01;
  char *message;
  AssertHelper local_b0;
  Message local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  Action<unsigned_char_(unsigned_short)> local_80;
  WithoutMatchers local_5d [13];
  Matcher<unsigned_short> local_50;
  MockSpec<unsigned_char_(unsigned_short)> local_38;
  uint8_t local_11;
  CpuImmediateTest *pCStack_10;
  uint8_t instruction_local;
  CpuImmediateTest *this_local;
  
  uVar1 = *(uint16_t *)&(this->super_CpuTest).field_0x112;
  (this->super_CpuTest).expected.pc = uVar1;
  (this->super_CpuTest).registers.pc = uVar1;
  local_11 = instruction;
  pCStack_10 = this;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,instruction);
  uVar2 = (this->super_CpuTest).expected.pc;
  if (SCARRY4((uint)uVar2,1)) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  (this->super_CpuTest).expected.pc = uVar2 + 1;
  uVar2 = *(ushort *)&(this->super_CpuTest).field_0x112;
  if (!SCARRY4((uint)uVar2,1)) {
    testing::Matcher<unsigned_short>::Matcher(&local_50,uVar2 + 1);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_38,&(this->super_CpuTest).mmu.super_MockMmu,&local_50);
    testing::internal::GetWithoutMatchers();
    this_00 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                        (&local_38,local_5d,(void *)0x0);
    this_01 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                        (this_00,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_immediate_instructions.cpp"
                         ,0x13,"mmu","read_byte(start_pc + 1)");
    testing::Return<unsigned_char>((testing *)&gtest_ar.message_,(this->super_CpuTest).field_0x114);
    testing::internal::ReturnAction::operator_cast_to_Action
              (&local_80,(ReturnAction *)&gtest_ar.message_);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(this_01,&local_80)
    ;
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_80);
    testing::internal::ReturnAction<unsigned_char>::~ReturnAction
              ((ReturnAction<unsigned_char> *)&gtest_ar.message_);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_38);
    testing::Matcher<unsigned_short>::~Matcher(&local_50);
    n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x02');
    testing::internal::EqHelper::
    Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
              ((EqHelper *)local_a0,"expected","registers",&(this->super_CpuTest).expected,
               &(this->super_CpuTest).registers);
    bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
    if (!bVar4) {
      testing::Message::Message(&local_a8);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_immediate_instructions.cpp"
                 ,0x17,message);
      testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      testing::Message::~Message(&local_a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
    return;
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void run_instruction(uint8_t instruction) {
        registers.pc = expected.pc = start_pc;
        stage_instruction(instruction);
        expected.pc += 1;

        EXPECT_CALL(mmu, read_byte(start_pc + 1))
                .WillOnce(Return(memory_content));

        step_execution(2);
        EXPECT_EQ(expected, registers);
    }